

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status
fdb_traverse_index(fdb_kvs_handle *handle,void *key,size_t keylen,fdb_index_traversal_callback cb,
                  void *ctx)

{
  fdb_kvs_id_t id;
  hbtrie *trie;
  void *value_buf;
  btreeblk_handle *handle_00;
  long lVar1;
  size_t sVar2;
  hbtrie_result hVar3;
  fdb_status fVar4;
  fdb_index_traversal_decision fVar5;
  ulong uVar6;
  size_t sVar7;
  undefined1 *buf;
  void *pvVar8;
  long in_FS_OFFSET;
  bool bVar9;
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  hbtrie_iterator hit;
  size_t local_40;
  size_t ret_keylen;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar4 = FDB_RESULT_INVALID_CONFIG;
    if ((handle->config).do_not_search_wal == true) {
      if (cb == (fdb_index_traversal_callback)0x0) {
        fVar4 = FDB_RESULT_INVALID_ARGS;
      }
      else {
        LOCK();
        bVar9 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
        if (bVar9) {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
        }
        UNLOCK();
        fVar4 = FDB_RESULT_HANDLE_BUSY;
        if (bVar9) {
          if (handle->shandle == (snap_handle *)0x0) {
            uStack_f0 = 0x11dfd4;
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
          }
          if (handle->shandle == (snap_handle *)0x0) {
            uStack_f0 = 0x11dfe6;
            fdb_sync_db_header(handle);
          }
          buf = local_e8;
          ret_keylen = (size_t)ctx;
          if (((keylen != 0) && (buf = local_e8, key != (void *)0x0)) &&
             (buf = local_e8, handle->kvs != (kvs_info *)0x0)) {
            uVar6 = (ulong)(handle->config).chunksize;
            hit._144_8_ = uVar6 + keylen;
            lVar1 = -(uVar6 + keylen + 0xf & 0xfffffffffffffff0);
            buf = local_e8 + lVar1;
            id = handle->kvs->id;
            *(undefined8 *)(local_e8 + lVar1 + -8) = 0x11e031;
            kvid2buf(uVar6,id,buf);
            *(undefined8 *)(local_e8 + lVar1 + -8) = 0x11e043;
            memcpy(buf + uVar6,key,keylen);
            keylen = hit._144_8_;
            key = buf;
          }
          if (*(char *)(in_FS_OFFSET + -0x58) == '\0') {
            *(undefined8 *)(buf + -8) = 0x11e154;
            fdb_traverse_index_cold_1();
          }
          if (*(char *)(in_FS_OFFSET + -0x38) == '\0') {
            *(undefined8 *)(buf + -8) = 0x11e15e;
            fdb_traverse_index_cold_2();
          }
          local_40 = 0;
          *(undefined8 *)(buf + -8) = 0x11e078;
          _fdb_sync_dirty_root(handle);
          trie = handle->trie;
          *(undefined8 *)(buf + -8) = 0x11e08e;
          hVar3 = hbtrie_iterator_init(trie,(hbtrie_iterator *)local_e8,key,keylen);
          *(undefined8 *)(buf + -8) = 0x11e099;
          _fdb_release_dirty_root(handle);
          if (hVar3 == HBTRIE_RESULT_SUCCESS) {
            do {
              pvVar8 = *(void **)(in_FS_OFFSET + -0x70);
              value_buf = *(void **)(in_FS_OFFSET + -0x50);
              *(undefined8 *)(buf + -8) = 0x11e0c6;
              hVar3 = hbtrie_next_partial((hbtrie_iterator *)local_e8,pvVar8,&local_40,value_buf);
              handle_00 = handle->bhandle;
              *(undefined8 *)(buf + -8) = 0x11e0d2;
              fVar4 = btreeblk_end(handle_00);
              sVar2 = ret_keylen;
              if (fVar4 != FDB_RESULT_SUCCESS || hVar3 != HBTRIE_RESULT_SUCCESS) break;
              if (handle->kvs == (kvs_info *)0x0) {
LAB_0011e0eb:
                pvVar8 = (void *)0x0;
                sVar7 = 0;
              }
              else {
                uVar6 = (ulong)(handle->config).chunksize;
                sVar7 = local_40 - uVar6;
                if (local_40 < uVar6) goto LAB_0011e0eb;
                pvVar8 = (void *)(uVar6 + *(long *)(in_FS_OFFSET + -0x70));
              }
              uVar6 = **(ulong **)(in_FS_OFFSET + -0x50);
              *(undefined8 *)(buf + -8) = 0x11e113;
              fVar5 = (*cb)(handle,pvVar8,sVar7,
                            uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                            (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                            (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38,(void *)sVar2);
            } while (fVar5 != 1);
          }
          *(undefined8 *)(buf + -8) = 0x11e124;
          hbtrie_iterator_free((hbtrie_iterator *)local_e8);
          fVar4 = FDB_RESULT_SUCCESS;
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
        }
      }
    }
  }
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_traverse_index(fdb_kvs_handle *handle,
                              const void *key,
                              size_t keylen,
                              fdb_index_traversal_callback cb,
                              void* ctx)
{
    uint64_t offset;
    struct docio_object _doc;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_status fs = FDB_RESULT_SUCCESS;
    fdb_txn *txn;
    //fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle->config.do_not_search_wal) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!cb) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    // Need to prepend 8-byte ID in multi-KVS mode.
    void* doc_key = (void*)key;
    size_t doc_keylen = keylen;

    if (handle->kvs && key && keylen) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_keylen = keylen + size_chunk;
        doc_key = alca(uint8_t, doc_keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_key);
        memcpy((uint8_t*)doc_key + size_chunk, key, keylen);
    }

    struct hbtrie_iterator hit;

    thread_local std::vector<char> ret_key_buf(FDB_MAX_KEYLEN_INTERNAL);
    thread_local std::vector<char> ret_value_buf(64);
    size_t ret_keylen = 0;

    _fdb_sync_dirty_root(handle);
    hr = hbtrie_iterator_init(handle->trie, &hit, doc_key, doc_keylen);
    _fdb_release_dirty_root(handle);

    while (hr == HBTRIE_RESULT_SUCCESS) {
        hr = hbtrie_next_partial(&hit, &ret_key_buf[0], &ret_keylen, &ret_value_buf[0]);
        fs = btreeblk_end(handle->bhandle);
        if (fs != FDB_RESULT_SUCCESS || hr != HBTRIE_RESULT_SUCCESS) {
            break;
        }

        void* ptr = nullptr;
        size_t ptr_keylen = 0;
        if (handle->kvs && ret_keylen >= handle->config.chunksize) {
            // In multi-KVS mode, skip the first 8-byte (KVS ID)
            // as it is not the part of user-key.
            ptr = &ret_key_buf[handle->config.chunksize];
            ptr_keylen = ret_keylen - handle->config.chunksize;
        }

        offset = *((uint64_t*)&ret_value_buf[0]);
        offset = _endian_decode(offset);

        fdb_index_traversal_decision dec =
            cb(handle, ptr, ptr_keylen, offset, ctx);
        if (dec == FDB_IT_STOP) {
            break;
        }
    }
    hbtrie_iterator_free(&hit);

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;;
}